

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set_variable.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalSetVariable::Sink
          (PhysicalSetVariable *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  GlobalSinkState *pGVar1;
  ClientConfig *this_00;
  InvalidInputException *this_01;
  allocator local_91;
  string local_90;
  Value local_70;
  
  if ((chunk->count == 1) && (pGVar1 = input->global_state, pGVar1->field_0x51 != '\x01')) {
    this_00 = ClientConfig::GetConfig(context->client);
    DataChunk::GetValue(&local_70,chunk,0,0);
    ClientConfig::SetUserVariable(this_00,&this->name,&local_70);
    Value::~Value(&local_70);
    pGVar1->field_0x51 = 1;
    return NEED_MORE_INPUT;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_90,"PhysicalSetVariable can only handle a single value",&local_91);
  InvalidInputException::InvalidInputException(this_01,&local_90);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalSetVariable::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<SetVariableGlobalState>();
	if (chunk.size() != 1 || gstate.is_set) {
		throw InvalidInputException("PhysicalSetVariable can only handle a single value");
	}
	auto &config = ClientConfig::GetConfig(context.client);
	config.SetUserVariable(name, chunk.GetValue(0, 0));
	gstate.is_set = true;
	return SinkResultType::NEED_MORE_INPUT;
}